

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bels.c
# Opt level: O0

err_t belsRecover2(octet *s,size_t count,size_t len,octet *si)

{
  bool_t bVar1;
  int iVar2;
  ulong n_00;
  word *a;
  size_t sVar3;
  ulong uVar4;
  long lVar5;
  word *a_00;
  word *a_01;
  void *in_RCX;
  ulong uVar6;
  size_t in_RDX;
  ulong in_RSI;
  void *in_RDI;
  void *stack;
  word *t;
  word *c;
  word *v;
  word *u;
  word *d;
  word *g;
  word *f;
  void *state;
  size_t deep;
  size_t j;
  size_t i;
  size_t n;
  void *in_stack_ffffffffffffff08;
  u64 *in_stack_ffffffffffffff10;
  word *in_stack_ffffffffffffff18;
  size_t in_stack_ffffffffffffff20;
  word *a_02;
  size_t in_stack_ffffffffffffff28;
  word *a_03;
  word *c_00;
  void *in_stack_ffffffffffffff48;
  size_t in_stack_ffffffffffffff50;
  word *in_stack_ffffffffffffff58;
  size_t in_stack_ffffffffffffff60;
  word *r;
  word *a_04;
  word *db;
  word *da;
  word *d_00;
  word *a_05;
  size_t local_48;
  ulong local_40;
  ulong local_38;
  err_t local_4;
  
  if (((((in_RDX == 0x10) || (in_RDX == 0x18)) || (in_RDX == 0x20)) &&
      ((in_RSI != 0 && (in_RSI < 0x11)))) &&
     ((bVar1 = memIsValid(in_RCX,in_RSI * (in_RDX + 1)), bVar1 != 0 &&
      (bVar1 = memIsValid(in_RDI,in_RDX), bVar1 != 0)))) {
    for (local_38 = 0; local_38 < in_RSI; local_38 = local_38 + 1) {
      if ((*(char *)((long)in_RCX + local_38 * (in_RDX + 1)) == '\0') ||
         (local_40 = local_38, 0x10 < *(byte *)((long)in_RCX + local_38 * (in_RDX + 1)))) {
        return 0x1f9;
      }
      while (local_40 = local_40 + 1, local_40 < in_RSI) {
        if (*(char *)((long)in_RCX + local_38 * (in_RDX + 1)) ==
            *(char *)((long)in_RCX + local_40 * (in_RDX + 1))) {
          return 0x1f9;
        }
      }
    }
    n_00 = in_RDX + 7 >> 3;
    a = (word *)ppMul_deep(in_stack_ffffffffffffff28,in_stack_ffffffffffffff20);
    sVar3 = ppMod_deep((size_t)in_stack_ffffffffffffff10,(size_t)in_stack_ffffffffffffff08);
    local_48 = utilMax(2,a,sVar3);
    for (local_38 = 1; local_38 < in_RSI; local_38 = local_38 + 1) {
      in_stack_ffffffffffffff48 = (void *)ppExGCD_deep(n_00 + 1,local_38 * n_00 + 1);
      in_stack_ffffffffffffff50 = ppMul_deep(in_stack_ffffffffffffff28,in_stack_ffffffffffffff20);
      in_stack_ffffffffffffff58 =
           (word *)ppMul_deep(in_stack_ffffffffffffff28,in_stack_ffffffffffffff20);
      in_stack_ffffffffffffff60 = ppMul_deep(in_stack_ffffffffffffff28,in_stack_ffffffffffffff20);
      in_stack_ffffffffffffff08 =
           (void *)ppMod_deep((size_t)in_stack_ffffffffffffff10,(size_t)in_stack_ffffffffffffff08);
      local_48 = utilMax(6,local_48,in_stack_ffffffffffffff48,in_stack_ffffffffffffff50,
                         in_stack_ffffffffffffff58,in_stack_ffffffffffffff60);
    }
    uVar4 = (in_RSI * 2 + -2) * n_00;
    uVar6 = (in_RSI + 1) * n_00;
    if (uVar4 < uVar6 || uVar4 - uVar6 == 0) {
      lVar5 = in_RSI + 1;
    }
    else {
      lVar5 = in_RSI * 2 + -2;
    }
    c_00 = (word *)(lVar5 * n_00);
    a_00 = (word *)blobCreate((size_t)in_stack_ffffffffffffff08);
    if (a_00 == (word *)0x0) {
      local_4 = 0x6e;
    }
    else {
      a_05 = a_00 + n_00 + 1;
      a_01 = a_05 + in_RSI * n_00 + 1;
      d_00 = a_01 + (in_RSI - 1) * n_00 + 1;
      da = d_00 + (in_RSI - 1) * n_00 + 1;
      db = da + n_00 + 1;
      a_03 = db + (in_RSI * 2 + -1) * n_00;
      uVar4 = (in_RSI * 2 + -2) * n_00;
      uVar6 = (in_RSI + 1) * n_00;
      if (uVar4 < uVar6 || uVar4 - uVar6 == 0) {
        lVar5 = in_RSI + 1;
      }
      else {
        lVar5 = in_RSI * 2 + -2;
      }
      a_02 = (word *)(lVar5 * n_00);
      r = a_03 + (long)a_02;
      a_04 = a_03;
      u64From(in_stack_ffffffffffffff10,in_stack_ffffffffffffff08,0x147c59);
      belsStdM((octet *)in_stack_ffffffffffffff18,(size_t)in_stack_ffffffffffffff10,
               (size_t)in_stack_ffffffffffffff08);
      u64From(in_stack_ffffffffffffff10,in_stack_ffffffffffffff08,0x147c98);
      a_05[n_00] = 1;
      a_00[n_00] = 1;
      for (local_38 = 1; local_38 < in_RSI; local_38 = local_38 + 1) {
        belsStdM((octet *)in_stack_ffffffffffffff18,(size_t)in_stack_ffffffffffffff10,
                 (size_t)in_stack_ffffffffffffff08);
        u64From(in_stack_ffffffffffffff10,in_stack_ffffffffffffff08,0x147d42);
        in_stack_ffffffffffffff10 = r;
        in_stack_ffffffffffffff08 = (void *)(local_38 * n_00 + 1);
        r = in_stack_ffffffffffffff10;
        ppExGCD(d_00,da,db,a_04,(size_t)in_stack_ffffffffffffff10,a,(size_t)a_05,a_00);
        iVar2 = wwCmpW(a_02,(size_t)in_stack_ffffffffffffff18,(word)in_stack_ffffffffffffff10);
        if (iVar2 != 0) {
          blobClose((blob_t)0x147dd7);
          return 0x1f9;
        }
        ppMul(c_00,a_03,(size_t)a_02,in_stack_ffffffffffffff18,(size_t)in_stack_ffffffffffffff10,
              in_stack_ffffffffffffff08);
        ppMul(c_00,a_03,(size_t)a_02,in_stack_ffffffffffffff18,(size_t)in_stack_ffffffffffffff10,
              in_stack_ffffffffffffff08);
        wwXor2(db + n_00,a_04,local_38 * 2 * n_00);
        u64From(in_stack_ffffffffffffff10,in_stack_ffffffffffffff08,0x147ec8);
        ppMul(c_00,a_03,(size_t)a_02,in_stack_ffffffffffffff18,(size_t)in_stack_ffffffffffffff10,
              in_stack_ffffffffffffff08);
        ppMul(c_00,a_03,(size_t)a_02,in_stack_ffffffffffffff18,(size_t)in_stack_ffffffffffffff10,
              in_stack_ffffffffffffff08);
        wwXor2(a_04 + local_38 * n_00,a_01,n_00 << 1);
        wwXor2(db,a_04,(local_38 + 2) * n_00);
        ppMul(c_00,a_03,(size_t)a_02,in_stack_ffffffffffffff18,(size_t)in_stack_ffffffffffffff10,
              in_stack_ffffffffffffff08);
        wwXor2(a_04 + n_00,a_05,local_38 * n_00);
        wwXor2(a_04 + local_38 * n_00,a_00,n_00);
        wwCopy(a_05,a_04,(local_38 + 1) * n_00);
        a_05[(local_38 + 1) * n_00] = 1;
        ppMod(r,a,in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,in_stack_ffffffffffffff50,
              in_stack_ffffffffffffff48);
      }
      belsStdM((octet *)in_stack_ffffffffffffff18,(size_t)in_stack_ffffffffffffff10,
               (size_t)in_stack_ffffffffffffff08);
      u64From(in_stack_ffffffffffffff10,in_stack_ffffffffffffff08,0x14810f);
      a_00[n_00] = 1;
      ppMod(r,a,in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,in_stack_ffffffffffffff50,
            in_stack_ffffffffffffff48);
      u64To(in_stack_ffffffffffffff10,(size_t)in_stack_ffffffffffffff08,(u64 *)0x14817a);
      blobClose((blob_t)0x148187);
      local_4 = 0;
    }
  }
  else {
    local_4 = 0x6d;
  }
  return local_4;
}

Assistant:

err_t belsRecover2(octet s[], size_t count, size_t len, const octet si[])
{
	size_t n, i, j, deep;
	void* state;
	word* f;
	word* g;
	word* d;
	word* u;
	word* v;
	word* c;
	word* t;
	void* stack;
	// проверить входные данные
	if ((len != 16 && len != 24 && len != 32) || count == 0 || count > 16 ||
		!memIsValid(si, count * (len + 1)) || !memIsValid(s, len))
		return ERR_BAD_INPUT;
	// проверить номера частичных секретов
	for (i = 0; i < count; ++i)
	{
		if (si[i * (len + 1)] == 0 || si[i * (len + 1)] > 16)
			return ERR_BAD_PUBKEY;
		for (j = i + 1; j < count; ++j)
			if (si[i * (len + 1)] == si[j * (len + 1)])
				return ERR_BAD_PUBKEY;
	}
	// расчет глубины стека
	n = W_OF_O(len);
	deep = utilMax(2,
		ppMul_deep(n, n),
		ppMod_deep(count * n, n + 1));
	for (i = 1; i < count; ++i)
		deep = utilMax(6,
			deep,
			ppExGCD_deep(n + 1, i * n + 1),
			ppMul_deep(i * n, i * n),
			ppMul_deep(2 * i * n, n),
			ppMul_deep(2 * n, i * n),
			ppMod_deep((2 * i + 1) * n, (i + 1) * n + 1));
	deep += O_OF_W(
		n + 1 +
		count * n + 1 +
		(count - 1) * n + 1 +
		(count - 1) * n + 1 +
		n + 1 +
		(2 * count - 1) * n +
		MAX2((2 * count - 2) * n, (count + 1) * n));
	// создать состояние
	state = blobCreate(deep);
	if (state == 0)
		return ERR_OUTOFMEMORY;
	// раскладка состояния
	f = (word*)state;
	g = f + n + 1;
	d = g + count * n + 1;
	u = d + (count - 1) * n + 1;
	v = u + (count - 1) * n + 1;
	c = v + n + 1;
	t = c + (2 * count - 1) * n;
	stack = t + MAX2((2 * count - 2) * n, (count + 1) * n);
	// [n]c(x) <- s1(x)
	wwFrom(c, si + 1, len);
	// [n + 1]g(x) <- x^l + m1(x)
	belsStdM((octet*)g, len, si[0]);
	wwFrom(g, g, len), g[n] = 1;
	// цикл по пользователям
	for (f[n] = 1, i = 1; i < count; ++i)
	{
		// [n + 1]f(x) <- x^l + mi(x)
		belsStdM((octet*)f, len, si[i * (len + 1)]);
		wwFrom(f, f, len);
		// найти d(x) = \gcd(f(x), g(x)) и коэфф. Безу [i * n]u(x), [n]v(x)
		ppExGCD(d, u, v, f, n + 1, g, i * n + 1, stack);
		ASSERT(u[i * n] == 0 && v[n] == 0);
		// d(x) != 1? 
		if (wwCmpW(d, i * n + 1, 1) != 0)
		{
			blobClose(state);
			return ERR_BAD_PUBKEY;
		}
		// [2 * i * n]c(x) <- u(x)f(x)c(x)
		// (с помощью [2 * i * n]t)
		ppMul(t, u, i * n, c, i * n, stack);
		ppMul(c, t, 2 * i * n, f, n, stack);
		wwXor2(c + n, t, 2 * i * n);
		// c(x) <- c(x) + v(x)g(x)si(x)
		// (с помощью [2 * n]d и [(i + 2) * n]t)
		wwFrom(t, si + i * (len + 1) + 1, len);
		ppMul(d, v, n, t, n, stack);
		ppMul(t, d, 2 * n, g, i * n, stack);
		wwXor2(t + i * n, d, 2 * n);
		wwXor2(c, t, (i + 2) * n);
		// [(i + 1) * n + 1]g(x) <- g(x)f(x)
		// (с помощью [(i + 1) * n]t)
		ppMul(t, f, n, g, i * n, stack);
		wwXor2(t + n, g, i * n);
		wwXor2(t + i * n, f, n);
		wwCopy(g, t, (i + 1) * n);
		g[(i + 1) * n] = 1;
		// [(i + 1) * n]c(x) <- c(x) mod g(x)
		ppMod(c, c, (2 * i + 1) * n, g, (i + 1) * n + 1, stack);
		ASSERT(c[(i + 1) * n] == 0);
	}
	// [n]s(x) <- c(x) mod (x^l + m0(x))
	belsStdM((octet*)f, len, 0);
	wwFrom(f, f, len), f[n] = 1;
	ppMod(c, c, count * n, f, n + 1, stack);
	ASSERT(c[n] == 0);
	wwTo(s, len, c);
	// завершение
	blobClose(state);
	return ERR_OK;
}